

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

void read_numbered_sentence_pair
               (string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
               vector<int,_std::allocator<int>_> *t,Dict *td,
               vector<int,_std::allocator<int>_> *identifiers)

{
  pointer piVar1;
  __type _Var2;
  istream *piVar3;
  vector<int,_std::allocator<int>_> *this;
  Dict *this_00;
  int local_204;
  vector<int,_std::allocator<int>_> *local_200;
  Dict *local_1f8;
  string word;
  string sep;
  istringstream in;
  byte abStack_190 [352];
  
  local_200 = t;
  local_1f8 = td;
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)line,_S_in);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sep,"|||",(allocator *)&local_204);
  if ((abStack_190[*(long *)(_in + -0x18)] & 5) == 0) {
    piVar1 = (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    while ((((piVar3 = std::operator>>((istream *)&in,(string *)&word),
             ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0 &&
             ((abStack_190[*(long *)(_in + -0x18)] & 5) == 0)) && (word._M_string_length != 0)) &&
           (_Var2 = std::operator==(&word,&sep), !_Var2))) {
      local_204 = atoi(word._M_dataplus._M_p);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(identifiers,&local_204);
    }
  }
  while ((this_00 = sd, this = s, (abStack_190[*(long *)(_in + -0x18)] & 5) == 0 &&
         (std::operator>>((istream *)&in,(string *)&word),
         (abStack_190[*(long *)(_in + -0x18)] & 5) == 0))) {
    _Var2 = std::operator==(&word,&sep);
    s = local_200;
    sd = local_1f8;
    if (!_Var2) {
      local_204 = dynet::Dict::convert(this_00,&word);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this,&local_204);
      s = this;
      sd = this_00;
    }
  }
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  return;
}

Assistant:

void read_numbered_sentence_pair(const std::string& line, std::vector<int>* s, Dict* sd, std::vector<int>* t, Dict* td, vector<int> &identifiers) 
{
    std::istringstream in(line);
    std::string word;
    std::string sep = "|||";
    Dict* d = sd;
    std::vector<int>* v = s; 

    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in) break;
        if (word == sep) { d = td; v = t; continue; }
        v->push_back(d->convert(word));
    }
}